

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O0

void __thiscall
TPZTensor<double>::Multiply
          (TPZTensor<double> *this,TPZTensor<double> *tensor,TPZTensor<double> *resp)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double *pdVar10;
  long in_RDX;
  long in_RDI;
  double YZ;
  double XZ;
  double XY;
  double ZZ;
  double YY;
  double XX;
  
  pdVar10 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),0);
  dVar1 = *pdVar10;
  pdVar10 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),3);
  dVar2 = *pdVar10;
  pdVar10 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),5);
  dVar3 = *pdVar10;
  pdVar10 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),1);
  dVar4 = *pdVar10;
  pdVar10 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),2);
  dVar5 = *pdVar10;
  pdVar10 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),4);
  dVar6 = *pdVar10;
  pdVar10 = TPZTensor<double>::XX((TPZTensor<double> *)0x14a3704);
  dVar7 = *pdVar10;
  pdVar10 = TPZTensor<double>::XY((TPZTensor<double> *)0x14a372a);
  dVar8 = *pdVar10;
  pdVar10 = TPZTensor<double>::XZ((TPZTensor<double> *)0x14a376a);
  dVar9 = *pdVar10;
  pdVar10 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDX + 8),0);
  *pdVar10 = dVar5 * dVar9 + dVar1 * dVar7 + dVar4 * dVar8;
  pdVar10 = TPZTensor<double>::XY((TPZTensor<double> *)0x14a37c3);
  dVar7 = *pdVar10;
  pdVar10 = TPZTensor<double>::YY((TPZTensor<double> *)0x14a37e9);
  dVar8 = *pdVar10;
  pdVar10 = TPZTensor<double>::YZ((TPZTensor<double> *)0x14a3829);
  dVar9 = *pdVar10;
  pdVar10 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDX + 8),3);
  *pdVar10 = dVar6 * dVar9 + dVar4 * dVar7 + dVar2 * dVar8;
  pdVar10 = TPZTensor<double>::XZ((TPZTensor<double> *)0x14a3883);
  dVar7 = *pdVar10;
  pdVar10 = TPZTensor<double>::YZ((TPZTensor<double> *)0x14a38a9);
  dVar8 = *pdVar10;
  pdVar10 = TPZTensor<double>::ZZ((TPZTensor<double> *)0x14a38ef);
  dVar9 = *pdVar10;
  pdVar10 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDX + 8),5);
  *pdVar10 = dVar3 * dVar9 + dVar5 * dVar7 + dVar6 * dVar8;
  pdVar10 = TPZTensor<double>::XY((TPZTensor<double> *)0x14a3958);
  dVar3 = *pdVar10;
  pdVar10 = TPZTensor<double>::YY((TPZTensor<double> *)0x14a3984);
  dVar7 = *pdVar10;
  pdVar10 = TPZTensor<double>::YZ((TPZTensor<double> *)0x14a39d3);
  dVar8 = *pdVar10;
  pdVar10 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDX + 8),1);
  *pdVar10 = dVar5 * dVar8 + dVar1 * dVar3 + dVar4 * dVar7;
  pdVar10 = TPZTensor<double>::XZ((TPZTensor<double> *)0x14a3a3c);
  dVar3 = *pdVar10;
  pdVar10 = TPZTensor<double>::YZ((TPZTensor<double> *)0x14a3a68);
  dVar7 = *pdVar10;
  pdVar10 = TPZTensor<double>::ZZ((TPZTensor<double> *)0x14a3ab7);
  dVar8 = *pdVar10;
  pdVar10 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDX + 8),2);
  *pdVar10 = dVar5 * dVar8 + dVar1 * dVar3 + dVar4 * dVar7;
  pdVar10 = TPZTensor<double>::XZ((TPZTensor<double> *)0x14a3b20);
  dVar1 = *pdVar10;
  pdVar10 = TPZTensor<double>::YZ((TPZTensor<double> *)0x14a3b4c);
  dVar3 = *pdVar10;
  pdVar10 = TPZTensor<double>::ZZ((TPZTensor<double> *)0x14a3b9b);
  dVar5 = *pdVar10;
  pdVar10 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDX + 8),4);
  *pdVar10 = dVar6 * dVar5 + dVar4 * dVar1 + dVar2 * dVar3;
  return;
}

Assistant:

void TPZTensor<T>::Multiply(const TPZTensor<T> tensor, TPZTensor<T> & resp) const {
    const T XX = this->fData[_XX_];
    const T YY = this->fData[_YY_];
    const T ZZ = this->fData[_ZZ_];
    const T XY = this->fData[_XY_];
    const T XZ = this->fData[_XZ_];
    const T YZ = this->fData[_YZ_];
    resp.fData[_XX_] = XX * tensor.XX() + XY * tensor.XY() + XZ * tensor.XZ();
    resp.fData[_YY_] = XY * tensor.XY() + YY * tensor.YY() + YZ * tensor.YZ();
    resp.fData[_ZZ_] = XZ * tensor.XZ() + YZ * tensor.YZ() + ZZ * tensor.ZZ();
    resp.fData[_XY_] = XX * tensor.XY() + XY * tensor.YY() + XZ * tensor.YZ();
    resp.fData[_XZ_] = XX * tensor.XZ() + XY * tensor.YZ() + XZ * tensor.ZZ();
    resp.fData[_YZ_] = XY * tensor.XZ() + YY * tensor.YZ() + YZ * tensor.ZZ();
}